

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<ArenaVector<wasm::Expression*>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          ArenaVector<wasm::Expression_*> *list)

{
  bool bVar1;
  size_t size_00;
  Expression **ppEVar2;
  Expression *elem;
  Iterator __end0;
  Iterator __begin0;
  ArenaVector<wasm::Expression_*> *__range2;
  size_t i;
  size_t size;
  ArenaVector<wasm::Expression_*> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  size_00 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&list->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size_00);
  }
  __range2 = (ArenaVector<wasm::Expression_*> *)0x0;
  join_0x00000010_0x00000000_ =
       ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                 (&list->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
  ;
  _elem = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                    (&list->
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  while( true ) {
    bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
            operator!=((Iterator *)&__end0.index,(Iterator *)&elem);
    if (!bVar1) break;
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)&__end0.index);
    *(Expression **)(*(long *)this + (long)__range2 * 8) = *ppEVar2;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
              ((Iterator *)&__end0.index);
    __range2 = (ArenaVector<wasm::Expression_*> *)
               ((long)&(__range2->
                       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                       data + 1);
  }
  *(size_t *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }